

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

void xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,xmlSchemaNodeInfoPtr ielem)

{
  xmlChar **ppxVar1;
  xmlSchemaIDCMatcherPtr pxVar2;
  void *pvVar3;
  xmlSchemaPSVIIDCBindingPtr pxVar4;
  xmlSchemaItemListPtr pxVar5;
  long lVar6;
  xmlSchemaPSVIIDCBindingPtr_conflict bind;
  xmlSchemaIDCMatcherPtr_conflict pxVar7;
  
  ielem->hasKeyrefs = 0;
  ielem->appliedXPath = 0;
  ppxVar1 = &ielem->localName;
  if ((ielem->flags & 1) == 0) {
    *ppxVar1 = (xmlChar *)0x0;
    ielem->nsName = (xmlChar *)0x0;
  }
  else {
    if (*ppxVar1 != (xmlChar *)0x0) {
      (*xmlFree)(*ppxVar1);
      *ppxVar1 = (xmlChar *)0x0;
    }
    if (ielem->nsName != (xmlChar *)0x0) {
      (*xmlFree)(ielem->nsName);
      ielem->nsName = (xmlChar *)0x0;
    }
  }
  if ((ielem->flags & 2) != 0) {
    if (ielem->value == (xmlChar *)0x0) goto LAB_00191540;
    (*xmlFree)(ielem->value);
  }
  ielem->value = (xmlChar *)0x0;
LAB_00191540:
  if (ielem->val != (xmlSchemaValPtr)0x0) {
    xmlSchemaFreeValue(ielem->val);
    ielem->val = (xmlSchemaValPtr)0x0;
  }
  pxVar7 = ielem->idcMatchers;
  if (pxVar7 != (xmlSchemaIDCMatcherPtr_conflict)0x0) {
    do {
      pxVar2 = pxVar7->next;
      if ((pxVar7->keySeqs != (xmlSchemaPSVIIDCKeyPtr **)0x0) && (0 < pxVar7->sizeKeySeqs)) {
        lVar6 = 0;
        do {
          if (pxVar7->keySeqs[lVar6] != (xmlSchemaPSVIIDCKeyPtr *)0x0) {
            (*xmlFree)(pxVar7->keySeqs[lVar6]);
            pxVar7->keySeqs[lVar6] = (xmlSchemaPSVIIDCKeyPtr *)0x0;
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 < pxVar7->sizeKeySeqs);
      }
      pxVar5 = pxVar7->targets;
      if (pxVar5 != (xmlSchemaItemListPtr)0x0) {
        if ((pxVar7->idcType == 0x18) && (0 < pxVar5->nbItems)) {
          lVar6 = 0;
          do {
            pvVar3 = pxVar5->items[lVar6];
            (*xmlFree)(*(void **)((long)pvVar3 + 8));
            (*xmlFree)(pvVar3);
            lVar6 = lVar6 + 1;
            pxVar5 = pxVar7->targets;
          } while (lVar6 < pxVar5->nbItems);
        }
        pxVar5 = pxVar7->targets;
        if (pxVar5 != (xmlSchemaItemListPtr)0x0) {
          if (pxVar5->items != (void **)0x0) {
            (*xmlFree)(pxVar5->items);
          }
          (*xmlFree)(pxVar5);
        }
        pxVar7->targets = (xmlSchemaItemListPtr)0x0;
      }
      if (pxVar7->htab != (xmlHashTablePtr)0x0) {
        xmlHashFree(pxVar7->htab,xmlFreeIDCHashEntry);
        pxVar7->htab = (xmlHashTablePtr)0x0;
      }
      pxVar7->next = (xmlSchemaIDCMatcherPtr)0x0;
      if (vctxt->idcMatcherCache != (xmlSchemaIDCMatcherPtr)0x0) {
        pxVar7->nextCached = vctxt->idcMatcherCache;
      }
      vctxt->idcMatcherCache = pxVar7;
      pxVar7 = pxVar2;
    } while (pxVar2 != (xmlSchemaIDCMatcherPtr)0x0);
    ielem->idcMatchers = (xmlSchemaIDCMatcherPtr_conflict)0x0;
  }
  bind = ielem->idcTable;
  if (ielem->idcTable != (xmlSchemaPSVIIDCBindingPtr_conflict)0x0) {
    do {
      pxVar4 = bind->next;
      xmlSchemaIDCFreeBinding(bind);
      bind = pxVar4;
    } while (pxVar4 != (xmlSchemaPSVIIDCBindingPtr)0x0);
    ielem->idcTable = (xmlSchemaPSVIIDCBindingPtr_conflict)0x0;
  }
  if (ielem->regexCtxt != (xmlRegExecCtxtPtr)0x0) {
    xmlRegFreeExecCtxt(ielem->regexCtxt);
    ielem->regexCtxt = (xmlRegExecCtxtPtr)0x0;
  }
  if (ielem->nsBindings != (xmlChar **)0x0) {
    (*xmlFree)(ielem->nsBindings);
    ielem->nsBindings = (xmlChar **)0x0;
    ielem->nbNsBindings = 0;
    ielem->sizeNsBindings = 0;
  }
  return;
}

Assistant:

static void
xmlSchemaClearElemInfo(xmlSchemaValidCtxtPtr vctxt,
		       xmlSchemaNodeInfoPtr ielem)
{
    ielem->hasKeyrefs = 0;
    ielem->appliedXPath = 0;
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_NAMES) {
	FREE_AND_NULL(ielem->localName);
	FREE_AND_NULL(ielem->nsName);
    } else {
	ielem->localName = NULL;
	ielem->nsName = NULL;
    }
    if (ielem->flags & XML_SCHEMA_NODE_INFO_FLAG_OWNED_VALUES) {
	FREE_AND_NULL(ielem->value);
    } else {
	ielem->value = NULL;
    }
    if (ielem->val != NULL) {
	/*
	* PSVI TODO: Be careful not to free it when the value is
	* exposed via PSVI.
	*/
	xmlSchemaFreeValue(ielem->val);
	ielem->val = NULL;
    }
    if (ielem->idcMatchers != NULL) {
	/*
	* REVISIT OPTIMIZE TODO: Use a pool of IDC matchers.
	*   Does it work?
	*/
	xmlSchemaIDCReleaseMatcherList(vctxt, ielem->idcMatchers);
#if 0
	xmlSchemaIDCFreeMatcherList(ielem->idcMatchers);
#endif
	ielem->idcMatchers = NULL;
    }
    if (ielem->idcTable != NULL) {
	/*
	* OPTIMIZE TODO: Use a pool of IDC tables??.
	*/
	xmlSchemaIDCFreeIDCTable(ielem->idcTable);
	ielem->idcTable = NULL;
    }
    if (ielem->regexCtxt != NULL) {
	xmlRegFreeExecCtxt(ielem->regexCtxt);
	ielem->regexCtxt = NULL;
    }
    if (ielem->nsBindings != NULL) {
	xmlFree((xmlChar **)ielem->nsBindings);
	ielem->nsBindings = NULL;
	ielem->nbNsBindings = 0;
	ielem->sizeNsBindings = 0;
    }
}